

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Thread::PushValues(Thread *this,ValueTypes *types,Values *values)

{
  uint uVar1;
  pointer pTVar2;
  pointer pTVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  uint local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pTVar3 - (long)pTVar2 >> 3 ==
      (long)(values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
            _M_impl.super__Vector_impl_data._M_start >> 4) {
    local_38 = &this->refs_;
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < (ulong)((long)pTVar3 - (long)pTVar2 >> 3); uVar5 = uVar5 + 1) {
      uVar1 = pTVar2[uVar5].enum_ + 0x15;
      if ((uVar1 < 6) && ((0x31U >> (uVar1 & 0x1f) & 1) != 0)) {
        local_3c = (uint)((ulong)((long)(this->values_).
                                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->values_).
                                       super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_38,&local_3c);
      }
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::push_back
                (&this->values_,
                 (value_type *)
                 ((long)&((values->
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          )._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar4));
      pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar4 = lVar4 + 0x10;
    }
    return;
  }
  __assert_fail("types.size() == values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                ,0x3e2,"void wabt::interp::Thread::PushValues(const ValueTypes &, const Values &)");
}

Assistant:

void Thread::PushValues(const ValueTypes& types, const Values& values) {
  assert(types.size() == values.size());
  for (size_t i = 0; i < types.size(); ++i) {
    if (IsReference(types[i])) {
      refs_.push_back(values_.size());
    }
    values_.push_back(values[i]);
  }
}